

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-utils.h
# Opt level: O2

bool __thiscall
wasm::BranchUtils::BranchSeeker::has(BranchSeeker *this,Expression *tree,Name target)

{
  bool bVar1;
  undefined1 auStack_148 [8];
  BranchSeeker seeker;
  BranchSeeker *local_18;
  Expression *tree_local;
  
  seeker.target.super_IString.str._M_len = target.super_IString.str._M_len;
  if (seeker.target.super_IString.str._M_len == 0) {
    bVar1 = false;
  }
  else {
    seeker._232_8_ = &seeker.types._M_h._M_rehash_policy._M_next_resize;
    auStack_148 = (undefined1  [8])0x0;
    seeker.
    super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
    .
    super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
    .replacep = (Expression **)0x0;
    seeker.
    super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
    .
    super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
    .currFunction = (Function *)0x0;
    seeker.
    super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
    .
    super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
    .stack.fixed._M_elems[9].currp = (Expression **)0x0;
    seeker.
    super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
    .
    super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    seeker.
    super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
    .
    super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    seeker.
    super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
    .
    super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    seeker.target.super_IString.str._M_str._0_4_ = 0;
    seeker.types._M_h._M_buckets = (__buckets_ptr)0x1;
    seeker.types._M_h._M_bucket_count = 0;
    seeker.types._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    seeker.types._M_h._M_element_count._0_4_ = 0x3f800000;
    seeker.types._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    seeker.types._M_h._M_rehash_policy._4_4_ = 0;
    seeker.types._M_h._M_rehash_policy._M_next_resize = 0;
    seeker.
    super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
    .
    super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
    .currModule = (Module *)tree;
    local_18 = this;
    Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
    ::walk((Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
            *)auStack_148,(Expression **)&local_18);
    bVar1 = (int)seeker.target.super_IString.str._M_str != 0;
    ~BranchSeeker((BranchSeeker *)auStack_148);
  }
  return bVar1;
}

Assistant:

static bool has(Expression* tree, Name target) {
    if (!target.is()) {
      return false;
    }
    BranchSeeker seeker(target);
    seeker.walk(tree);
    return seeker.found > 0;
  }